

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O1

UBool __thiscall
icu_63::Normalizer2Impl::hasCompBoundaryBefore(Normalizer2Impl *this,uint8_t *src,uint8_t *limit)

{
  byte *pbVar1;
  ushort uVar2;
  UCPTrie *trie;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  byte t3;
  byte bVar6;
  
  bVar5 = true;
  if (src == limit) {
    return '\x01';
  }
  bVar6 = *src;
  uVar4 = (uint)bVar6;
  if ((char)bVar6 < '\0') {
    pbVar1 = src + 1;
    if (pbVar1 != limit) {
      if (bVar6 < 0xe0) {
        if ((0xc1 < bVar6) && ((byte)(*pbVar1 ^ 0x80) < 0x40)) {
          uVar4 = (uint)this->normTrie->index[bVar6 & 0x1f] + (*pbVar1 ^ 0x80);
          goto LAB_002aae48;
        }
      }
      else if (bVar6 < 0xf0) {
        uVar3 = bVar6 & 0xf;
        if (((((byte)" 000000000000\x1000"[uVar3] >> (*pbVar1 >> 5) & 1) != 0) && (src + 2 != limit)
            ) && (uVar4 = src[2] ^ 0x80, (byte)uVar4 < 0x40)) {
          uVar4 = *(ushort *)
                   ((long)this->normTrie->index + (ulong)(uVar3 * 0x80 + (*pbVar1 & 0x3f) * 2)) +
                  uVar4;
          goto LAB_002aae48;
        }
      }
      else if (bVar6 < 0xf5) {
        if ((((((uint)(int)""[*pbVar1 >> 4] >> (uVar4 - 0xf0 & 0x1f) & 1) != 0) &&
             (src + 2 != limit)) && (bVar6 = src[2] + 0x80, bVar6 < 0x40)) &&
           ((src + 3 != limit && (t3 = src[3] + 0x80, t3 < 0x40)))) {
          uVar4 = *pbVar1 & 0x3f | (uVar4 - 0xf0) * 0x40;
          trie = this->normTrie;
          if (uVar4 < trie->shifted12HighStart) {
            uVar4 = ucptrie_internalSmallU8Index_63(trie,uVar4,bVar6,t3);
          }
          else {
            uVar4 = trie->dataLength - 2;
          }
          goto LAB_002aae48;
        }
      }
    }
    uVar4 = this->normTrie->dataLength - 1;
  }
LAB_002aae48:
  uVar2 = *(ushort *)((long)(this->normTrie->data).ptr0 + (long)(int)uVar4 * 2);
  if (this->minNoNoCompNoMaybeCC <= uVar2) {
    bVar5 = uVar2 < this->minMaybeYes && this->limitNoNo <= uVar2;
  }
  return bVar5;
}

Assistant:

UBool Normalizer2Impl::hasCompBoundaryBefore(const uint8_t *src, const uint8_t *limit) const {
    if (src == limit) {
        return TRUE;
    }
    uint16_t norm16;
    UCPTRIE_FAST_U8_NEXT(normTrie, UCPTRIE_16, src, limit, norm16);
    return norm16HasCompBoundaryBefore(norm16);
}